

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* __thiscall
fmt::v7::
make_args_checked<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int,char[65],char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *__return_storage_ptr__,v7 *this,char (*format_str) [65],
          remove_reference_t<std::__cxx11::basic_string<char>_> *args,
          remove_reference_t<unsigned_int> *args_1,
          remove_reference_t<std::__cxx11::basic_string<char>_> *args_2,
          remove_reference_t<unsigned_int> *args_3)

{
  remove_reference_t<unsigned_int> *args_local_3;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args_local_2;
  remove_reference_t<unsigned_int> *args_local_1;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args_local;
  char (*format_str_local) [65];
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::format_arg_store(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)format_str
                     ,(uint *)args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                     (uint *)args_2);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}